

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<short,unsigned_long>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  unsigned_long in_stack_ffffffffffffffa8;
  unsigned_long u;
  unsigned_long local_48;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_3a;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  
  u = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>(&local_3a,&u);
  su.m_int = u;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>(&st2,&su);
  local_3a.m_int = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_3a,&u);
  if (su.m_int < 0x8000) {
    local_3a.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_3a);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator*(&local_3a,st2);
    operator*(u,local_3a);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,su);
    u = 1;
    local_48._0_4_ = 1;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,(int *)&local_48);
    local_48._0_4_ = 1;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_48);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    local_48._0_4_ = 1;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_48);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator%(&local_3a,st2);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,su);
    u = 1;
    local_48._0_4_ = 1;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_48);
    local_48._0_4_ = 1;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,(int *)&local_48);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator/(&local_3a,st2);
    operator/(u,local_3a);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator+(&local_3a,st2);
    operator+(u,local_3a);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,su);
    local_48._0_4_ = 0;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,(int *)&local_48);
    u = 0;
    local_48._0_4_ = 0;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_48);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator-(&local_3a,st2);
    operator-(in_stack_ffffffffffffffa8,
              (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    local_48._0_4_ = 1;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,(int *)&local_48);
    local_48._0_4_ = 1;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_48);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,su);
    u = 1;
    local_48 = CONCAT44(local_48._4_4_,1);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_48);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator<<((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_3a,su);
    operator<<(SVar1.m_int,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_3a,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_3a,u);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator>>((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_3a,su);
    operator>>(SVar1.m_int,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_3a,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_3a,su);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator&(&local_3a,st2);
    local_48 = BinaryAndHelper<unsigned_long,_short,_2>::And(su.m_int,local_3a.m_int & (ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_48);
    local_3a.m_int = (ushort)su.m_int & (ushort)u & local_3a.m_int & st2.m_int;
    local_48 = BinaryOrHelper<unsigned_long,_short,_2>::Or(su.m_int,(ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_48);
    local_3a.m_int = (ushort)su.m_int | (ushort)u | local_3a.m_int | st2.m_int;
    local_48 = BinaryXorHelper<unsigned_long,_short,_2>::Xor(su.m_int,local_3a.m_int ^ (ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_48);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}